

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O2

MainFunc __thiscall kj::TestRunner::getMain(TestRunner *this)

{
  StringPtr extendedDescription;
  StringPtr helpText;
  MainBuilder *pMVar1;
  Iface *extraout_RDX;
  undefined8 *in_RSI;
  MainFunc MVar2;
  StringPtr briefDescription;
  StringPtr argumentTitle;
  StringPtr helpText_00;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr version;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_e8;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_d8;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface> local_c8;
  MainBuilder local_b8;
  char *local_a8;
  undefined8 uStack_a0;
  char *local_98;
  undefined8 uStack_90;
  OptionName local_88;
  undefined1 local_78;
  char *local_70;
  OptionName local_68;
  undefined1 local_58;
  char *local_50;
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:210:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:210:27)>
  local_48;
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:207:35),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:207:35)>
  local_38;
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:202:44),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_test_c__:202:44)>
  local_28;
  
  local_98 = "";
  uStack_90 = 1;
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  briefDescription.content.size_ = 0x4b;
  briefDescription.content.ptr =
       "Run all tests that have been linked into the binary with this test runner.";
  version.content.size_ = 0x28;
  version.content.ptr = "KJ Test Runner (version not applicable)";
  MainBuilder::MainBuilder
            (&local_b8,(ProcessContext *)*in_RSI,version,briefDescription,extendedDescription);
  local_68.isLong = false;
  local_68.field_1.shortName = 'f';
  local_58 = 1;
  local_50 = "filter";
  Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_1_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_c8,&local_28);
  local_a8 = 
  "Run only the specified test case(s). You may use a \'*\' wildcard in <file>. You may also omit any prefix of <file>\'s path; test from all matching files will run. You may specify multiple filters; any test matching at least one filter will run. <line> may be a range, e.g. \"100-500\"."
  ;
  uStack_a0 = 0x11a;
  helpText.content.size_ = 0x11a;
  helpText.content.ptr =
       "Run only the specified test case(s). You may use a \'*\' wildcard in <file>. You may also omit any prefix of <file>\'s path; test from all matching files will run. You may specify multiple filters; any test matching at least one filter will run. <line> may be a range, e.g. \"100-500\"."
  ;
  argumentTitle.content.size_ = 0x10;
  argumentTitle.content.ptr = "<file>[:<line>]";
  names._M_len = 2;
  names._M_array = &local_68;
  pMVar1 = MainBuilder::addOptionWithArg
                     (&local_b8,names,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_c8,argumentTitle
                      ,helpText);
  local_88.isLong = false;
  local_88.field_1.shortName = 'l';
  local_78 = 1;
  local_70 = "list";
  Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_3_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_d8,&local_38);
  helpText_00.content.size_ = 0x7b;
  helpText_00.content.ptr =
       "List all test cases that would run, but don\'t run them. If --filter is specified then only the match tests will be listed."
  ;
  names_00._M_len = 2;
  names_00._M_array = &local_88;
  pMVar1 = MainBuilder::addOption
                     (pMVar1,names_00,(Function<kj::MainBuilder::Validity_()> *)&local_d8,
                      helpText_00);
  Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_5_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_e8,&local_48);
  MainBuilder::callAfterParsing(pMVar1,(Function<kj::MainBuilder::Validity_()> *)&local_e8);
  MainBuilder::build((MainBuilder *)this);
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_e8);
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_d8);
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose(&local_c8);
  MainBuilder::~MainBuilder(&local_b8);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

MainFunc getMain() {
    return MainBuilder(context, "KJ Test Runner (version not applicable)",
        "Run all tests that have been linked into the binary with this test runner.")
        .addOptionWithArg({'f', "filter"}, KJ_BIND_METHOD(*this, setFilter), "<file>[:<line>]",
            "Run only the specified test case(s). You may use a '*' wildcard in <file>. You may "
            "also omit any prefix of <file>'s path; test from all matching files will run. "
            "You may specify multiple filters; any test matching at least one filter will run. "
            "<line> may be a range, e.g. \"100-500\".")
        .addOption({'l', "list"}, KJ_BIND_METHOD(*this, setList),
            "List all test cases that would run, but don't run them. If --filter is specified "
            "then only the match tests will be listed.")
        .callAfterParsing(KJ_BIND_METHOD(*this, run))
        .build();
  }